

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pBuffer,MAP_TYPE MapType)

{
  int iVar1;
  iterator __it;
  undefined4 extraout_var;
  char (*in_R8) [23];
  MAP_TYPE *in_R9;
  string msg;
  MAP_TYPE local_49;
  IBuffer *local_48;
  string local_40;
  
  local_49 = MapType;
  local_48 = pBuffer;
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[25]>(&local_40,(char (*) [25])0x7eaa27);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"UnmapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x720);
    std::__cxx11::string::~string((string *)&local_40);
  }
  __it = std::
         _Hashtable<Diligent::IBuffer_*,_std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IBuffer_*>,_std::hash<Diligent::IBuffer_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->m_DbgMappedBuffers)._M_h,&local_48);
  if (__it.
      super__Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = (*(local_48->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    FormatString<char[9],char_const*,char[23]>
              (&local_40,(Diligent *)0x6f3938,(char (*) [9])CONCAT44(extraout_var,iVar1),
               (char **)"\' has not been mapped.",in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"UnmapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x724);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (*(MAP_TYPE *)
       ((long)__it.
              super__Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
              ._M_cur + 0x10) != MapType) {
    FormatString<char[10],Diligent::MAP_TYPE,char[63],Diligent::MAP_TYPE>
              (&local_40,(Diligent *)"MapType (",(char (*) [10])&local_49,
               (MAP_TYPE *)") does not match the map type that was used to map the buffer ",
               (char (*) [63])
               ((long)__it.
                      super__Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
                      ._M_cur + 0x10),in_R9);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"UnmapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x725);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::
  _Hashtable<Diligent::IBuffer_*,_std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IBuffer_*>,_std::hash<Diligent::IBuffer_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->m_DbgMappedBuffers)._M_h,
          (const_iterator)
          __it.
          super__Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
          ._M_cur);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UnmapBuffer(IBuffer* pBuffer, MAP_TYPE MapType)
{
    VERIFY(pBuffer, "pBuffer must not be null");
#ifdef DILIGENT_DEBUG
    {
        auto MappedBufferIt = m_DbgMappedBuffers.find(pBuffer);
        VERIFY(MappedBufferIt != m_DbgMappedBuffers.end(), "Buffer '", pBuffer->GetDesc().Name, "' has not been mapped.");
        VERIFY(MappedBufferIt->second.MapType == MapType, "MapType (", MapType, ") does not match the map type that was used to map the buffer ", MappedBufferIt->second.MapType);
        m_DbgMappedBuffers.erase(MappedBufferIt);
    }
#endif
}